

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int loop(void)

{
  int iVar1;
  int iVar2;
  ostream *this;
  long *plVar3;
  string command;
  Command cmd;
  string local_d0;
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  string local_90;
  Command local_70;
  
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,">>> ",4);
    get_command_abi_cxx11_();
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_b0,local_a8 + (long)local_b0);
    Command::Command(&local_70,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    Command::get_command_name_abi_cxx11_(&local_d0,&local_70);
    iVar1 = std::__cxx11::string::compare((char *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if (iVar1 != 0) {
      iVar2 = Command::execute(&local_70);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Return code for [",0x11);
      Command::get_command_name_abi_cxx11_(&local_d0,&local_70);
      this = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_d0._M_dataplus._M_p,local_d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(this,"] : ",4);
      plVar3 = (long *)std::ostream::operator<<(this,iVar2);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      std::ostream::flush();
    }
    Command::~Command(&local_70);
    if (local_b0 != local_a0) {
      operator_delete(local_b0,local_a0[0] + 1);
    }
  } while (iVar1 != 0);
  return 0;
}

Assistant:

int loop()
{
    bool finished(false);
    while (!finished)
    {
        print_prompt();
        std::string command = get_command();
        Command cmd = Command{command};

        if (cmd.get_command_name() == "exit")
        {
            finished = true;
        }
        else
        {
            int return_code = cmd.execute();
            std::cout << "Return code for [" << cmd.get_command_name() << "] : " << return_code << std::endl;
            std::cout.flush();
        }
    }
    return 0;
}